

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::MultiplyRow(Matrix *this,int row,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  bool local_44;
  Fraction local_40;
  Fraction local_38;
  
  local_40 = coefficient;
  Fraction::Fraction(&local_38,1);
  bVar2 = operator==(&local_40,&local_38);
  if ((bVar2) || (this->m_ < 1)) {
    local_44 = false;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    local_44 = false;
    do {
      lVar1 = *(long *)&(this->elements_).
                        super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[row].
                        super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                        super__Vector_impl_data;
      Fraction::Fraction(&local_38,0);
      bVar2 = operator!=((Fraction *)(lVar1 + lVar4),&local_38);
      if (bVar2) {
        Fraction::operator*=
                  ((Fraction *)
                   (*(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[row].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data + lVar4),&local_40);
        local_44 = true;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar3 < this->m_);
  }
  return local_44;
}

Assistant:

bool Matrix::MultiplyRow(int row, Fraction coefficient) {
  if (coefficient == 1) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[row][column] != 0) {
      result = true;
      elements_[row][column] *= coefficient;
    }
  }

  return result;
}